

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

ostream * jsonnet::internal::operator<<(ostream *o,Token *v)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  int *in_RSI;
  ostream *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  Kind in_stack_ffffffffffffffdc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = std::operator==(in_stack_ffffffffffffffe0,
                          (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (bVar1) {
    pcVar3 = Token::toString(in_stack_ffffffffffffffdc);
    std::operator<<(in_RDI,pcVar3);
  }
  else if (*in_RSI == 0xc) {
    poVar2 = std::operator<<(in_RDI,"\"");
    poVar2 = std::operator<<(poVar2,(string *)(in_RSI + 8));
    std::operator<<(poVar2,"\"");
  }
  else {
    poVar2 = std::operator<<(in_RDI,"(");
    pcVar3 = Token::toString(in_stack_ffffffffffffffdc);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,", \"");
    poVar2 = std::operator<<(poVar2,(string *)(in_RSI + 8));
    std::operator<<(poVar2,"\")");
  }
  return in_RDI;
}

Assistant:

static inline std::ostream &operator<<(std::ostream &o, const Token &v)
{
    if (v.data == "") {
        o << Token::toString(v.kind);
    } else if (v.kind == Token::OPERATOR) {
        o << "\"" << v.data << "\"";
    } else {
        o << "(" << Token::toString(v.kind) << ", \"" << v.data << "\")";
    }
    return o;
}